

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

void __thiscall antlr::Parser::match(Parser *this,int t)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  bool in_stack_00000013;
  int in_stack_00000014;
  RefToken *in_stack_00000018;
  int in_stack_00000024;
  char **in_stack_00000028;
  MismatchedTokenException *in_stack_00000030;
  string *in_stack_00000040;
  undefined1 local_48 [32];
  undefined1 local_28 [28];
  int local_c;
  
  local_c = in_ESI;
  if ((DEBUG_PARSER & 1) != 0) {
    (**(code **)(*in_RDI + 0xd8))();
    poVar2 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    poVar2 = std::operator<<(poVar2,") with LA(1)=");
    iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
  if (iVar1 != local_c) {
    if ((DEBUG_PARSER & 1) != 0) {
      (**(code **)(*in_RDI + 0xd8))();
      poVar2 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
      iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,"!=");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_c);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    uVar4 = __cxa_allocate_exception(200);
    (**(code **)(*in_RDI + 200))();
    (**(code **)(*in_RDI + 0xd0))();
    (**(code **)(*in_RDI + 0x18))(local_28,in_RDI,1);
    (**(code **)(*in_RDI + 0x40))(local_48);
    MismatchedTokenException::MismatchedTokenException
              (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
               in_stack_00000014,in_stack_00000013,in_stack_00000040);
    __cxa_throw(uVar4,&MismatchedTokenException::typeinfo,
                MismatchedTokenException::~MismatchedTokenException);
  }
  (**(code **)(*in_RDI + 0x60))();
  return;
}

Assistant:

virtual void match(int t)
	{
		if ( DEBUG_PARSER )
		{
			traceIndent();
			ANTLR_USE_NAMESPACE(std)cout << "enter match(" << t << ") with LA(1)=" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
		}
		if ( LA(1) != t )
		{
			if ( DEBUG_PARSER )
			{
				traceIndent();
				ANTLR_USE_NAMESPACE(std)cout << "token mismatch: " << LA(1) << "!=" << t << ANTLR_USE_NAMESPACE(std)endl;
			}
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), t, false, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}